

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

void bus0_pipe_close(void *arg)

{
  nni_list *list;
  int iVar1;
  bus0_sock *s;
  bus0_pipe *p;
  void *arg_local;
  
  list = *(nni_list **)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x238));
  nni_aio_close((nni_aio *)((long)arg + 0x70));
  nni_mtx_lock((nni_mtx *)(list + 1));
  nni_lmq_flush((nni_lmq *)((long)arg + 0x10));
  iVar1 = nni_list_active(list,arg);
  if (iVar1 != 0) {
    nni_list_remove(list,arg);
  }
  nni_mtx_unlock((nni_mtx *)(list + 1));
  return;
}

Assistant:

static void
bus0_pipe_close(void *arg)
{
	bus0_pipe *p = arg;
	bus0_sock *s = p->bus;

	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);

	nni_mtx_lock(&s->mtx);
	nni_lmq_flush(&p->send_queue);
	if (nni_list_active(&s->pipes, p)) {
		nni_list_remove(&s->pipes, p);
	}
	nni_mtx_unlock(&s->mtx);
}